

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_read_pcm_frames_le(drwav *pWav,drwav_uint64 framesToRead,void *pBufferOut)

{
  drwav_uint32 dVar1;
  size_t sVar2;
  long in_RSI;
  drwav *in_RDI;
  drwav_uint64 bytesToRead;
  drwav_uint32 bytesPerFrame;
  void *in_stack_00000fd8;
  size_t in_stack_00000fe0;
  drwav *in_stack_00000fe8;
  ulong local_10;
  
  if ((in_RDI == (drwav *)0x0) || (in_RSI == 0)) {
    local_10 = 0;
  }
  else if (in_RDI->translatedFormatTag == 2 || in_RDI->translatedFormatTag == 0x11) {
    local_10 = 0;
  }
  else {
    dVar1 = drwav_get_bytes_per_pcm_frame(in_RDI);
    if (dVar1 == 0) {
      local_10 = 0;
    }
    else if (in_RSI * (ulong)dVar1 == 0) {
      local_10 = 0;
    }
    else {
      sVar2 = drwav_read_raw(in_stack_00000fe8,in_stack_00000fe0,in_stack_00000fd8);
      local_10 = sVar2 / dVar1;
    }
  }
  return local_10;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_le(drwav* pWav, drwav_uint64 framesToRead, void* pBufferOut)
{
    drwav_uint32 bytesPerFrame;
    drwav_uint64 bytesToRead;   /* Intentionally uint64 instead of size_t so we can do a check that we're not reading too much on 32-bit builds. */

    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }

    /* Cannot use this function for compressed formats. */
    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        return 0;
    }

    bytesPerFrame = drwav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }

    /* Don't try to read more samples than can potentially fit in the output buffer. */
    bytesToRead = framesToRead * bytesPerFrame;
    if (bytesToRead > DRWAV_SIZE_MAX) {
        bytesToRead = (DRWAV_SIZE_MAX / bytesPerFrame) * bytesPerFrame; /* Round the number of bytes to read to a clean frame boundary. */
    }

    /*
    Doing an explicit check here just to make it clear that we don't want to be attempt to read anything if there's no bytes to read. There
    *could* be a time where it evaluates to 0 due to overflowing.
    */
    if (bytesToRead == 0) {
        return 0;
    }

    return drwav_read_raw(pWav, (size_t)bytesToRead, pBufferOut) / bytesPerFrame;
}